

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

string * __thiscall OpenMD::EAMAdapter::getLatticeType_abi_cxx11_(EAMAdapter *this)

{
  string *in_RDI;
  EAMParameters eamParam;
  EAMAdapter *in_stack_00000068;
  string local_38 [56];
  
  getEAMParam(in_stack_00000068);
  std::__cxx11::string::string((string *)in_RDI,local_38);
  EAMParameters::~EAMParameters((EAMParameters *)0x289f75);
  return in_RDI;
}

Assistant:

std::string EAMAdapter::getLatticeType() {
    EAMParameters eamParam = getEAMParam();
    return eamParam.latticeType;
  }